

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwInit(void)

{
  bool bVar1;
  FILE *pFVar2;
  char *pcVar3;
  int iVar4;
  char local_38 [8];
  char buf [32];
  int i;
  time_t tid;
  
  iVar4 = mwInited + 1;
  bVar1 = mwInited < 1;
  mwInited = iVar4;
  if (bVar1) {
    pFVar2 = mwLogR();
    if (pFVar2 == (FILE *)0x0) {
      mwLogFile("memwatch.log");
    }
    pFVar2 = mwLogR();
    if (pFVar2 == (FILE *)0x0) {
      buf[0x1c] = '\x01';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      for (; (int)buf._28_4_ < 100; buf._28_4_ = buf._28_4_ + 1) {
        sprintf(local_38,"memwat%02d.log",(ulong)(uint)buf._28_4_);
        mwLogFile(local_38);
        pFVar2 = mwLogR();
        if (pFVar2 != (FILE *)0x0) break;
      }
    }
    mwStatList = (mwStat *)0x0;
    mwStatTotAlloc = 0;
    mwStatCurAlloc = 0;
    mwStatMaxAlloc = 0;
    mwStatNumAlloc = 0;
    mwNmlCurAlloc = 0;
    mwNmlNumAlloc = 0;
    for (mwDataSize = 0x38; mwDataSize % 8 != 0; mwDataSize = mwDataSize + 1) {
    }
    if (mwInfoWritten == 0) {
      mwInfoWritten = 1;
      time((time_t *)&stack0xfffffffffffffff0);
      mwWrite("\n============= MEMWATCH 2.71 Copyright (C) 1992-1999 Johan Lindh =============\n");
      pcVar3 = ctime((time_t *)&stack0xfffffffffffffff0);
      mwWrite("\nStarted at %s\n",pcVar3);
      mwWrite("Modes: ");
      mwWrite("__STDC__ ");
      mwWrite("64-bit ");
      mwWrite("mwDWORD==(unsigned int)\n");
      mwWrite("mwROUNDALLOC==%d sizeof(mwData)==%d mwDataSize==%d\n",8,0x38,(ulong)(uint)mwDataSize)
      ;
      mwWrite("\n");
      mwFlush();
    }
    if (mwUseAtexit != 0) {
      atexit(mwAbort);
    }
  }
  return;
}

Assistant:

void mwInit(void)
{
	time_t tid;

	if (mwInited++ > 0) {
		return;
	}

	MW_MUTEX_INIT();

	/* start a log if none is running */
	if (mwLogR() == NULL) {
		mwLogFile("memwatch.log");
	}
	if (mwLogR() == NULL) {
		int i;
		char buf[32];
		/* oops, could not open it! */
		/* probably because it's already open */
		/* so we try some other names */
		for (i = 1; i < 100; i++) {
			sprintf(buf, "memwat%02d.log", i);
			mwLogFile(buf);
			if (mwLogR() != NULL) {
				break;
			}
		}
	}

	/* initialize the statistics */
	mwStatList = NULL;
	mwStatTotAlloc = 0L;
	mwStatCurAlloc = 0L;
	mwStatMaxAlloc = 0L;
	mwStatNumAlloc = 0L;
	mwNmlCurAlloc = 0L;
	mwNmlNumAlloc = 0L;

	/* calculate the buffer size to use for a mwData */
	mwDataSize = sizeof(mwData);
	while (mwDataSize % mwROUNDALLOC) {
		mwDataSize ++;
	}

	/* write informational header if needed */
	if (!mwInfoWritten) {
		mwInfoWritten = 1;
		(void) time(&tid);
		mwWrite(
			"\n============="
			" MEMWATCH " VERSION " Copyright (C) 1992-1999 Johan Lindh "
			"=============\n");
		mwWrite("\nStarted at %s\n", ctime(&tid));

		/**************************************************************** Generic */
		mwWrite("Modes: ");
#ifdef mwNew
		mwWrite("C++ ");
#endif /* mwNew */
#ifdef __STDC__
		mwWrite("__STDC__ ");
#endif /* __STDC__ */
#ifdef mw16BIT
		mwWrite("16-bit ");
#endif
#ifdef mw32BIT
		mwWrite("32-bit ");
#endif
#ifdef mw64BIT
		mwWrite("64-bit ");
#endif
		mwWrite("mwDWORD==(" mwDWORD_DEFINED ")\n");
		mwWrite("mwROUNDALLOC==%d sizeof(mwData)==%d mwDataSize==%d\n",
				mwROUNDALLOC, sizeof(mwData), mwDataSize);
		/**************************************************************** Generic */

		/************************************************************ Microsoft C */
#ifdef _MSC_VER
		mwWrite("Compiled using Microsoft C" CPPTEXT
				" %d.%02d\n", _MSC_VER / 100, _MSC_VER % 100);
#endif /* _MSC_VER */
		/************************************************************ Microsoft C */

		/************************************************************** Borland C */
#ifdef __BORLANDC__
		mwWrite("Compiled using Borland C"
#ifdef __cplusplus
				"++ %d.%01d\n", __BCPLUSPLUS__ / 0x100, (__BCPLUSPLUS__ % 0x100) / 0x10);
#else
				" %d.%01d\n", __BORLANDC__ / 0x100, (__BORLANDC__ % 0x100) / 0x10);
#endif /* __cplusplus */
#endif /* __BORLANDC__ */
		/************************************************************** Borland C */

		/************************************************************** Watcom C */
#ifdef __WATCOMC__
		mwWrite("Compiled using Watcom C %d.%02d ",
				__WATCOMC__ / 100, __WATCOMC__ % 100);
#ifdef __FLAT__
		mwWrite("(32-bit flat model)");
#endif /* __FLAT__ */
		mwWrite("\n");
#endif /* __WATCOMC__ */
		/************************************************************** Watcom C */

		mwWrite("\n");
		FLUSH();
	}

	if (mwUseAtexit) {
		(void) atexit(mwAbort);
	}
	return;
}